

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,void *dictStart,
              size_t dictSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  byte *pbVar4;
  byte bVar5;
  BYTE BVar6;
  ushort uVar7;
  undefined8 uVar8;
  ushort uVar9;
  uint uVar10;
  long lVar11;
  ushort *puVar12;
  long lVar13;
  ushort *puVar14;
  BYTE *pBVar15;
  size_t __n;
  BYTE *pBVar16;
  ulong uVar17;
  BYTE *d_1;
  BYTE *pBVar18;
  BYTE *pBVar19;
  uint uVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  BYTE *d;
  BYTE *s;
  ushort *puVar23;
  ushort *__src;
  ushort *puVar24;
  ulong uVar25;
  int local_68;
  
  if (source == (char *)0x0) {
    return -1;
  }
  lVar11 = (long)dictStart + dictSize;
  if (dictStart == (void *)0x0) {
    lVar11 = 0;
  }
  if (maxOutputSize == 0) {
    if (compressedSize != 1) {
      return -1;
    }
    return -(uint)(*source != '\0');
  }
  if (compressedSize == 0) {
    return -1;
  }
  puVar1 = (ushort *)(source + compressedSize);
  pBVar2 = (BYTE *)(dest + maxOutputSize);
  pBVar19 = (BYTE *)dest;
  puVar24 = (ushort *)source;
  if (maxOutputSize < 0x40) goto LAB_001133eb;
LAB_001130f7:
  __src = (ushort *)((long)puVar24 + 1);
  bVar5 = (byte)*puVar24;
  uVar17 = (ulong)(uint)(bVar5 >> 4);
  if (bVar5 >> 4 == 0xf) {
    if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_001133d9;
    puVar14 = puVar24 + 1;
    uVar20 = 0;
    puVar24 = puVar24 + 8;
    do {
      puVar23 = __src;
      puVar12 = puVar24;
      __src = (ushort *)((long)puVar23 + 1);
      uVar20 = uVar20 + *(byte *)((long)puVar12 + -0xf);
      puVar14 = (ushort *)((long)puVar14 + 1);
      puVar24 = (ushort *)((long)puVar12 + 1);
    } while (puVar12 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
             *(byte *)((long)puVar12 + -0xf) == 0xff);
    uVar17 = (ulong)uVar20 + 0xf;
    pBVar18 = pBVar19 + uVar17;
    if ((CARRY8((ulong)pBVar19,uVar17)) || ((ulong)-(long)puVar14 < uVar17)) {
      __src = puVar12 + -7;
      goto LAB_001133d9;
    }
    uVar10 = (uint)bVar5;
    if (dest + (long)maxOutputSize + -0x20 < pBVar18) goto LAB_001134d1;
    puVar24 = (ushort *)((ulong)uVar20 + (long)puVar12 + 1);
    if (puVar1 + -0x10 < puVar24) {
      __src = puVar12 + -7;
      uVar10 = (uint)bVar5;
      goto LAB_001134d1;
    }
    lVar13 = 0;
    do {
      uVar8 = *(undefined8 *)((byte *)((long)__src + lVar13) + 8);
      pBVar21 = pBVar19 + lVar13;
      *(undefined8 *)pBVar21 = *(undefined8 *)((long)__src + lVar13);
      *(undefined8 *)(pBVar21 + 8) = uVar8;
      pbVar4 = (byte *)((long)puVar23 + lVar13 + 0x11);
      uVar8 = *(undefined8 *)(pbVar4 + 8);
      *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)pbVar4;
      *(undefined8 *)(pBVar21 + 0x18) = uVar8;
      lVar13 = lVar13 + 0x20;
    } while (pBVar21 + 0x20 < pBVar18);
  }
  else {
    pBVar18 = pBVar19 + uVar17;
    uVar10 = (uint)bVar5;
    if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_001134d1;
    uVar8 = *(undefined8 *)((long)puVar24 + 9);
    *(undefined8 *)pBVar19 = *(undefined8 *)__src;
    *(undefined8 *)(pBVar19 + 8) = uVar8;
    puVar24 = (ushort *)(uVar17 + (long)__src);
  }
  uVar7 = *puVar24;
  uVar17 = (ulong)uVar7;
  __src = puVar24 + 1;
  pBVar21 = pBVar18 + -uVar17;
  uVar25 = (ulong)(bVar5 & 0xf);
  if (uVar25 == 0xf) {
    if ((dictSize < 0x10000) && (pBVar21 + dictSize < dest)) goto LAB_001133d9;
    uVar10 = 0;
    puVar24 = __src;
    do {
      __src = (ushort *)((long)puVar24 + 1);
      if (puVar1 + -2 <= __src) goto LAB_001133d9;
      uVar9 = *puVar24;
      uVar10 = uVar10 + (byte)uVar9;
      puVar24 = __src;
    } while ((byte)uVar9 == 0xff);
    uVar25 = (ulong)uVar10;
    if ((BYTE *)(-uVar25 - 0x10) < pBVar18) goto LAB_001133d9;
    __n = uVar25 + 0x13;
    if (pBVar2 + -0x40 <= pBVar18 + uVar25 + 0x13) goto LAB_0011357c;
LAB_00113291:
    if ((dictSize < 0x10000) && (pBVar21 + dictSize < dest)) goto LAB_001133d9;
    pBVar3 = pBVar18 + __n;
    pBVar19 = pBVar3;
    puVar24 = __src;
    if (pBVar21 < dest) {
      if (pBVar2 + -5 < pBVar3) goto LAB_001133d9;
      uVar25 = (long)dest - (long)pBVar21;
      uVar17 = __n - uVar25;
      if (__n < uVar25 || uVar17 == 0) {
        memmove(pBVar18,(void *)(lVar11 - uVar25),__n);
      }
      else {
        memcpy(pBVar18,(void *)(lVar11 - uVar25),uVar25);
        pBVar19 = pBVar18 + uVar25;
        pBVar18 = (BYTE *)dest;
        if ((ulong)((long)pBVar19 - (long)dest) < uVar17) {
          for (; pBVar19 < pBVar3; pBVar19 = pBVar19 + 1) {
            *pBVar19 = *pBVar18;
            pBVar18 = pBVar18 + 1;
          }
        }
        else {
          memcpy(pBVar19,dest,uVar17);
          pBVar19 = pBVar3;
        }
      }
    }
    else if (uVar7 < 0x10) {
      LZ4_memcpy_using_offset(pBVar18,pBVar21,pBVar3,uVar17);
    }
    else {
      do {
        uVar8 = *(undefined8 *)(pBVar18 + -uVar17 + 8);
        *(undefined8 *)pBVar18 = *(undefined8 *)(pBVar18 + -uVar17);
        *(undefined8 *)(pBVar18 + 8) = uVar8;
        uVar8 = *(undefined8 *)(pBVar18 + -uVar17 + 0x10 + 8);
        *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)(pBVar18 + -uVar17 + 0x10);
        *(undefined8 *)(pBVar18 + 0x18) = uVar8;
        pBVar18 = pBVar18 + 0x20;
      } while (pBVar18 < pBVar3);
    }
  }
  else {
    __n = uVar25 + 4;
    if (pBVar2 + -0x40 <= pBVar18 + uVar25 + 4) goto LAB_0011357c;
    if ((pBVar21 < dest) || (uVar7 < 8)) goto LAB_00113291;
    *(undefined8 *)pBVar18 = *(undefined8 *)pBVar21;
    *(undefined8 *)(pBVar18 + 8) = *(undefined8 *)(pBVar21 + 8);
    *(undefined2 *)(pBVar18 + 0x10) = *(undefined2 *)(pBVar21 + 0x10);
    pBVar19 = pBVar18 + uVar25 + 4;
    puVar24 = __src;
  }
  goto LAB_001130f7;
LAB_0011357c:
  if ((dictSize < 0x10000) && (pBVar21 + dictSize < dest)) goto LAB_001133d9;
  pBVar3 = pBVar18 + __n;
  pBVar19 = pBVar3;
  puVar24 = __src;
  if (pBVar21 < dest) {
    if (pBVar2 + -5 < pBVar3) goto LAB_001133d9;
    uVar25 = (long)dest - (long)pBVar21;
    uVar17 = __n - uVar25;
    if (__n < uVar25 || uVar17 == 0) {
      memmove(pBVar18,(void *)(lVar11 - uVar25),__n);
    }
    else {
      memcpy(pBVar18,(void *)(lVar11 - uVar25),uVar25);
      pBVar19 = pBVar18 + uVar25;
      pBVar18 = (BYTE *)dest;
      if ((ulong)((long)pBVar19 - (long)dest) < uVar17) {
        for (; pBVar19 < pBVar3; pBVar19 = pBVar19 + 1) {
          *pBVar19 = *pBVar18;
          pBVar18 = pBVar18 + 1;
        }
      }
      else {
        memcpy(pBVar19,dest,uVar17);
        pBVar19 = pBVar3;
      }
    }
  }
  else {
    if ((uint)uVar17 < 8) {
      pBVar18[0] = '\0';
      pBVar18[1] = '\0';
      pBVar18[2] = '\0';
      pBVar18[3] = '\0';
      *pBVar18 = *pBVar21;
      pBVar18[1] = pBVar21[1];
      pBVar18[2] = pBVar21[2];
      pBVar18[3] = pBVar21[3];
      uVar17 = (ulong)((uint)uVar17 << 2);
      uVar25 = (ulong)*(uint *)((long)inc32table + uVar17);
      *(undefined4 *)(pBVar18 + 4) = *(undefined4 *)(pBVar21 + uVar25);
      pBVar21 = pBVar21 + (uVar25 - (long)*(int *)((long)dec64table + uVar17));
    }
    else {
      *(undefined8 *)pBVar18 = *(undefined8 *)pBVar21;
      pBVar21 = pBVar21 + 8;
    }
    pBVar15 = pBVar18 + 8;
    if (pBVar2 + -0xc < pBVar3) {
      if (pBVar2 + -5 < pBVar3) goto LAB_001133d9;
      pBVar18 = pBVar2 + -7;
      pBVar16 = pBVar21;
      pBVar22 = pBVar15;
      if (pBVar15 < pBVar18) {
        do {
          *(undefined8 *)pBVar22 = *(undefined8 *)pBVar16;
          pBVar22 = pBVar22 + 8;
          pBVar16 = pBVar16 + 8;
        } while (pBVar22 < pBVar18);
        pBVar21 = pBVar21 + ((long)pBVar18 - (long)pBVar15);
        pBVar15 = pBVar18;
      }
      for (; pBVar15 < pBVar3; pBVar15 = pBVar15 + 1) {
        BVar6 = *pBVar21;
        pBVar21 = pBVar21 + 1;
        *pBVar15 = BVar6;
      }
    }
    else {
      *(undefined8 *)pBVar15 = *(undefined8 *)pBVar21;
      if (0x10 < __n) {
        pBVar18 = pBVar18 + 0x10;
        do {
          pBVar21 = pBVar21 + 8;
          *(undefined8 *)pBVar18 = *(undefined8 *)pBVar21;
          pBVar18 = pBVar18 + 8;
        } while (pBVar18 < pBVar3);
      }
    }
  }
LAB_001133eb:
  while( true ) {
    __src = (ushort *)((long)puVar24 + 1);
    bVar5 = (byte)*puVar24;
    uVar17 = (ulong)(uint)(bVar5 >> 4);
    if (bVar5 >> 4 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= __src) ||
       (dest + (long)maxOutputSize + -0x20 < pBVar19)) goto LAB_001134cd;
    uVar8 = *(undefined8 *)((long)puVar24 + 9);
    *(undefined8 *)pBVar19 = *(undefined8 *)__src;
    *(undefined8 *)(pBVar19 + 8) = uVar8;
    pBVar18 = pBVar19 + uVar17;
    uVar25 = (ulong)(bVar5 & 0xf);
    puVar24 = (ushort *)(uVar17 + (long)__src);
    __src = puVar24 + 1;
    uVar7 = *puVar24;
    uVar17 = (ulong)uVar7;
    pBVar21 = pBVar18 + -uVar17;
    if (((uVar25 == 0xf) || (uVar7 < 8)) || (pBVar21 < dest)) goto LAB_0011351f;
    *(undefined8 *)pBVar18 = *(undefined8 *)pBVar21;
    *(undefined8 *)(pBVar18 + 8) = *(undefined8 *)(pBVar21 + 8);
    *(undefined2 *)(pBVar18 + 0x10) = *(undefined2 *)(pBVar21 + 0x10);
    pBVar19 = pBVar18 + uVar25 + 4;
    puVar24 = __src;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_001133d9;
  puVar24 = puVar24 + 1;
  uVar10 = 0;
  do {
    uVar7 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar10 = uVar10 + (byte)uVar7;
    puVar24 = (ushort *)((long)puVar24 + 1);
  } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar7 == 0xff);
  uVar17 = (ulong)uVar10 + 0xf;
  if ((CARRY8((ulong)pBVar19,uVar17)) || ((ulong)-(long)puVar24 < uVar17)) goto LAB_001133d9;
LAB_001134cd:
  pBVar18 = pBVar19 + uVar17;
  uVar10 = (uint)bVar5;
LAB_001134d1:
  puVar24 = (ushort *)(uVar17 + (long)__src);
  if ((pBVar2 + -0xc < pBVar18) || (puVar1 + -4 < puVar24)) {
    if ((puVar24 == puVar1) && (pBVar18 <= pBVar2)) {
      memmove(pBVar19,__src,uVar17);
      return ((int)pBVar19 + (int)uVar17) - (int)dest;
    }
LAB_001133d9:
    local_68 = (int)source;
    return ~(uint)__src + local_68;
  }
  do {
    *(undefined8 *)pBVar19 = *(undefined8 *)__src;
    pBVar19 = pBVar19 + 8;
    __src = __src + 4;
  } while (pBVar19 < pBVar18);
  uVar17 = (ulong)*puVar24;
  __src = puVar24 + 1;
  pBVar21 = pBVar18 + -uVar17;
  uVar25 = (ulong)(uVar10 & 0xf);
LAB_0011351f:
  if ((int)uVar25 == 0xf) {
    uVar10 = 0;
    do {
      uVar7 = *__src;
      __src = (ushort *)((long)__src + 1);
      uVar10 = uVar10 + (byte)uVar7;
    } while ((byte)uVar7 == 0xff && __src < puVar1 + -2);
    uVar25 = (ulong)uVar10 + 0xf;
    if ((puVar1 + -2 <= __src) || (CARRY8((ulong)pBVar18,uVar25))) goto LAB_001133d9;
  }
  __n = uVar25 + 4;
  goto LAB_0011357c;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int maxOutputSize,
                                     const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}